

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O1

fdb_status
fdb_iterator_sequence_init
          (fdb_kvs_handle *handle,fdb_iterator **ptr_iterator,fdb_seqnum_t start_seq,
          fdb_seqnum_t end_seq,fdb_iterator_opt_t opt)

{
  uint32_t *puVar1;
  fdb_kvs_handle *pfVar2;
  ulong uVar3;
  hbtrie *trie;
  fdb_kvs_id_t id;
  wal_iterator *wal_itr;
  long lVar4;
  fdb_seqnum_t fVar5;
  bool bVar6;
  fdb_status fVar7;
  fdb_status fVar8;
  fdb_iterator *iterator;
  hbtrie_iterator *it;
  char *pcVar9;
  btree_iterator *it_00;
  wal_item *pwVar10;
  ulong *initial_key;
  wal_item *initial_key_00;
  ulong chunksize;
  ulong uStack_110;
  wal_item local_108;
  wal_item_header local_88;
  fdb_iterator **local_50;
  fdb_seqnum_t local_48;
  long local_40;
  ulong local_38;
  fdb_seqnum_t _start_seq;
  
  initial_key_00 = &local_108;
  if (handle == (fdb_kvs_handle *)0x0) {
    fVar7 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    fVar7 = FDB_RESULT_INVALID_ARGS;
    if ((ptr_iterator != (fdb_iterator **)0x0) && (end_seq == 0 || start_seq <= end_seq)) {
      local_38 = start_seq >> 0x38 | (start_seq & 0xff000000000000) >> 0x28 |
                 (start_seq & 0xff0000000000) >> 0x18 | (start_seq & 0xff00000000) >> 8 |
                 (start_seq & 0xff000000) << 8 | (start_seq & 0xff0000) << 0x18 |
                 (start_seq & 0xff00) << 0x28 | start_seq << 0x38;
      local_108.header = &local_88;
      fVar7 = FDB_RESULT_INVALID_CONFIG;
      if ((handle->config).seqtree_opt == '\x01') {
        local_50 = ptr_iterator;
        local_48 = start_seq;
        if (handle->shandle == (snap_handle *)0x0) {
          uStack_110 = 0x131b61;
          fdb_check_file_reopen(handle,(file_status_t *)0x0);
          uStack_110 = 0x131b69;
          fdb_sync_db_header(handle);
        }
        uStack_110 = 0x131b78;
        iterator = (fdb_iterator *)calloc(1,0x98);
        if (handle->shandle == (snap_handle *)0x0) {
          uStack_110 = 0x131cad;
          fVar7 = fdb_snapshot_open(handle,(fdb_kvs_handle **)iterator,0xffffffffffffffff);
          if (fVar7 != FDB_RESULT_SUCCESS) {
            uStack_110 = 0x131ccd;
            pcVar9 = _fdb_kvs_get_name(handle,handle->file);
            fdb_log_impl(&handle->log_callback,2,fVar7,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/iterator.cc"
                         ,"fdb_iterator_sequence_init",0x14a,
                         "Failed to create an sequence iterator instance due to the failure of open operation on the KV Store \'%s\' in a database file \'%s\'"
                         ,pcVar9,handle->file->filename);
            return fVar7;
          }
          bVar6 = false;
        }
        else {
          iterator->handle = handle;
          bVar6 = true;
        }
        fVar5 = local_48;
        iterator->snapshot_handle = bVar6;
        iterator->hbtrie_iterator = (hbtrie_iterator *)0x0;
        iterator->_key = (void *)0x0;
        iterator->_keylen = 0;
        iterator->opt = opt;
        iterator->_offset = 0xffffffffffffffff;
        iterator->_seqnum = local_48;
        (iterator->field_12).end_seqnum = -(ulong)(end_seq == 0) | end_seq;
        (iterator->field_10).start_seqnum = local_48;
        iterator->start_key = (void *)0x0;
        iterator->end_key = (void *)0x0;
        uStack_110 = 0x131bf5;
        wal_itr_init(handle->file,iterator->handle->shandle,false,&iterator->wal_itr);
        pfVar2 = iterator->handle;
        if (pfVar2->kvs == (kvs_info *)0x0) {
          uStack_110 = 0x131d25;
          it_00 = (btree_iterator *)calloc(1,0x68);
          iterator->seqtree_iterator = it_00;
          initial_key = &local_38;
          if (fVar5 == 0) {
            initial_key = (ulong *)0x0;
          }
          uStack_110 = 0x131d40;
          btree_iterator_init((pfVar2->field_6).seqtree,it_00,initial_key);
          local_88.key = (ulong *)0x0;
          local_88.keylen = 0;
        }
        else {
          chunksize = (ulong)(handle->config).chunksize;
          local_40 = chunksize + 8;
          lVar4 = -(ulong)((int)local_40 + 0xfU & 0xfffffff0);
          initial_key_00 = (wal_item *)((long)&local_108 + lVar4);
          uVar3 = pfVar2->kvs->id;
          *(ulong *)initial_key_00 =
               uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
               | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 |
               (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
          *(ulong *)((long)&local_108 + lVar4 + 8) = local_38;
          *(undefined8 *)((long)&uStack_110 + lVar4) = 0x131c44;
          it = (hbtrie_iterator *)calloc(1,0x98);
          iterator->seqtrie_iterator = it;
          trie = (pfVar2->field_6).seqtrie;
          *(undefined8 *)((long)&uStack_110 + lVar4) = 0x131c5c;
          hbtrie_iterator_init(trie,it,initial_key_00,0x10);
          id = iterator->handle->kvs->id;
          local_88.key = initial_key_00;
          *(undefined8 *)((long)&uStack_110 + lVar4) = 0x131c76;
          kvid2buf(chunksize,id,initial_key_00);
          local_88.keylen = (uint16_t)local_40;
          *(fdb_seqnum_t *)((long)initial_key_00 + chunksize) = fVar5;
        }
        local_108.seqnum = fVar5;
        wal_itr = iterator->wal_itr;
        *(undefined8 *)((long)initial_key_00 + -8) = 0x131d62;
        pwVar10 = wal_itr_search_greater(wal_itr,&local_108);
        iterator->tree_cursor = pwVar10;
        if (pwVar10 != (wal_item *)0x0) {
          iterator->tree_cursor_start = pwVar10;
        }
        iterator->tree_cursor_prev = pwVar10;
        iterator->direction = '\0';
        iterator->status = '\0';
        iterator->_dhandle = (docio_handle *)0x0;
        *local_50 = iterator;
        puVar1 = &iterator->handle->num_iterators;
        *puVar1 = *puVar1 + 1;
        *(undefined8 *)((long)initial_key_00 + -8) = 0x131d9d;
        fVar8 = fdb_iterator_next(iterator);
        fVar7 = FDB_RESULT_SUCCESS;
        if (fVar8 == FDB_RESULT_FILE_CORRUPTION) {
          *(undefined8 *)((long)initial_key_00 + -8) = 0x131db1;
          fdb_iterator_close(iterator);
          fVar7 = FDB_RESULT_FILE_CORRUPTION;
        }
      }
    }
  }
  return fVar7;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_sequence_init(fdb_kvs_handle *handle,
                                      fdb_iterator **ptr_iterator,
                                      const fdb_seqnum_t start_seq,
                                      const fdb_seqnum_t end_seq,
                                      fdb_iterator_opt_t opt)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (ptr_iterator == NULL || (end_seq && start_seq > end_seq)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    fdb_status fs;
    fdb_seqnum_t _start_seq = _endian_encode(start_seq);
    fdb_kvs_id_t _kv_id;
    size_t size_id, size_seq;
    uint8_t *start_seq_kv;
    struct wal_item query;
    struct wal_item_header query_key;
    LATENCY_STAT_START();

    query.header = &query_key;

    // Sequence trees are a must for byseq operations
    if (handle->config.seqtree_opt != FDB_SEQTREE_USE) {
        return FDB_RESULT_INVALID_CONFIG;
    }

    if (!handle->shandle) {
        // If compaction is already done before this line,
        // handle->file needs to be replaced with handle->new_file.
        fdb_check_file_reopen(handle, NULL);
        fdb_sync_db_header(handle);
    }

    size_id = sizeof(fdb_kvs_id_t);
    size_seq = sizeof(fdb_seqnum_t);
    fdb_iterator *iterator = (fdb_iterator *)calloc(1, sizeof(fdb_iterator));

    if (!handle->shandle) {
        // snapshot handle doesn't exist
        // open a new handle to make the iterator handle as a snapshot
        fs = fdb_snapshot_open(handle, &iterator->handle, FDB_SNAPSHOT_INMEM);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(&handle->log_callback, FDB_LOG_ERROR, fs,
                    "Failed to create an sequence iterator instance due to the "
                    "failure of "
                    "open operation on the KV Store '%s' in a database file '%s'",
                    _fdb_kvs_get_name(handle, handle->file),
                    handle->file->filename);
            return fs;
        }
        iterator->snapshot_handle = false;
    } else {
        // Snapshot handle exists
        // We don't need to open a new handle.. just point to the snapshot handle.
        iterator->handle = handle;
        iterator->snapshot_handle = true;
    }

    iterator->hbtrie_iterator = NULL;
    iterator->_key = NULL;
    iterator->_keylen = 0;
    iterator->opt = opt;
    iterator->_offset = BLK_NOT_FOUND;
    iterator->_seqnum = start_seq;

    // For easy API call, treat zero seq as 0xffff...
    // (because zero seq number is not used)
    if (end_seq == 0) {
        iterator->end_seqnum = SEQNUM_NOT_USED;
    } else {
        iterator->end_seqnum = end_seq;
    }

    iterator->start_seqnum = start_seq;

    iterator->start_key = NULL;
    iterator->end_key = NULL;

    wal_itr_init(handle->file, iterator->handle->shandle, false,
                 &iterator->wal_itr);

    if (iterator->handle->kvs) {
        int size_chunk = handle->config.chunksize;
        // create an iterator handle for hb-trie
        start_seq_kv = alca(uint8_t, size_chunk + size_seq);
        _kv_id = _endian_encode(iterator->handle->kvs->id);
        memcpy(start_seq_kv, &_kv_id, size_id);
        memcpy(start_seq_kv + size_id, &_start_seq, size_seq);

        iterator->seqtrie_iterator = (struct hbtrie_iterator *)
                                     calloc(1, sizeof(struct hbtrie_iterator));
        hbtrie_iterator_init(iterator->handle->seqtrie,
                             iterator->seqtrie_iterator,
                             start_seq_kv, size_id + size_seq);

        query_key.key = start_seq_kv;
        kvid2buf(size_chunk, iterator->handle->kvs->id, start_seq_kv);
        memcpy(start_seq_kv + size_chunk, &start_seq, size_seq);
        query_key.keylen = size_chunk + size_seq;
        query.seqnum = start_seq;
        iterator->tree_cursor = wal_itr_search_greater(iterator->wal_itr,
                                                       &query);
    } else {
        // create an iterator handle for b-tree
        iterator->seqtree_iterator = (struct btree_iterator *)
                                     calloc(1, sizeof(struct btree_iterator));
        btree_iterator_init(iterator->handle->seqtree,
                            iterator->seqtree_iterator,
                            (void *)(start_seq ? &_start_seq : NULL));
        query_key.key = (void*)NULL;
        query_key.keylen = 0;
        query.seqnum = start_seq;
        iterator->tree_cursor = wal_itr_search_greater(iterator->wal_itr,
                                                       &query);
    }

    // to know reverse iteration endpoint store the start cursor
    if (iterator->tree_cursor) {
        iterator->tree_cursor_start = iterator->tree_cursor;
    }
    iterator->tree_cursor_prev = iterator->tree_cursor;
    iterator->direction = FDB_ITR_DIR_NONE;
    iterator->status = FDB_ITR_IDX;
    iterator->_dhandle = NULL; // populated at the first iterator movement

    *ptr_iterator = iterator;

    ++iterator->handle->num_iterators; // Increment the iterator counter of the KV handle
    fs = fdb_iterator_next(iterator); // position cursor at first key
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_SEQ_INIT);
    if (fs == FDB_RESULT_FILE_CORRUPTION) {
        fdb_iterator_close(iterator);
        return fs;
    }

    return FDB_RESULT_SUCCESS;
}